

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall leveldb::VersionSet::SetupOtherInputs(VersionSet *this,Compaction *c)

{
  bool bVar1;
  uint uVar2;
  undefined4 uVar3;
  int64_t iVar4;
  Compaction *pCVar5;
  InternalKey *pIVar6;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *this_00;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *pvVar7;
  size_type sVar8;
  size_type sVar9;
  size_type sVar10;
  long in_RDI;
  long in_FS_OFFSET;
  Slice SVar11;
  int64_t expanded0_size;
  int64_t inputs1_size;
  int64_t inputs0_size;
  int level;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded1;
  vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> expanded0;
  InternalKey new_limit;
  InternalKey new_start;
  InternalKey all_limit;
  InternalKey all_start;
  InternalKey largest;
  InternalKey smallest;
  Compaction *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdc4;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  InternalKey *in_stack_fffffffffffffdd0;
  Compaction *in_stack_fffffffffffffdd8;
  InternalKey *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  Version *in_stack_fffffffffffffdf0;
  int level_00;
  InternalKey *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 uVar12;
  Compaction *in_stack_fffffffffffffe10;
  Compaction *pCVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  uint uVar14;
  undefined1 local_f8 [224];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = Compaction::level(in_stack_fffffffffffffdb8);
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  AddBoundaryInputs((InternalKeyComparator *)in_stack_fffffffffffffdf0,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_fffffffffffffde0);
  GetRange((VersionSet *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
           (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
           in_stack_fffffffffffffde0,(InternalKey *)in_stack_fffffffffffffdd8,
           in_stack_fffffffffffffdd0);
  Version::GetOverlappingInputs
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
             (InternalKey *)in_stack_fffffffffffffdd8,
             (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             in_stack_fffffffffffffdd0);
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  GetRange2((VersionSet *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
            (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
            in_stack_fffffffffffffe18,
            (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
            in_stack_fffffffffffffe10,
            (InternalKey *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
            in_stack_fffffffffffffe00);
  bVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::empty
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  if (!bVar1) {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_fffffffffffffdb8);
    Version::GetOverlappingInputs
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
               (InternalKey *)in_stack_fffffffffffffdd8,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_fffffffffffffdd0);
    AddBoundaryInputs((InternalKeyComparator *)in_stack_fffffffffffffdf0,
                      (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                      (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                      in_stack_fffffffffffffde0);
    iVar4 = TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                           *)in_stack_fffffffffffffdd8);
    pCVar5 = (Compaction *)
             TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_fffffffffffffdd8);
    pIVar6 = (InternalKey *)
             TotalFileSize((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_fffffffffffffdd8);
    this_00 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
              std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                        ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                          *)in_stack_fffffffffffffdb8);
    pvVar7 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
             std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                       ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )in_stack_fffffffffffffdb8);
    if (pvVar7 < this_00) {
      pvVar7 = (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               ExpandedCompactionByteSizeLimit((Options *)in_stack_fffffffffffffdb8);
      if ((long)&(pIVar6->rep_)._M_dataplus._M_p + (long)&pCVar5->level_ < (long)pvVar7) {
        InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
        InternalKey::InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
        GetRange((VersionSet *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                 (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 in_stack_fffffffffffffde0,(InternalKey *)in_stack_fffffffffffffdd8,
                 in_stack_fffffffffffffdd0);
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::vector
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_fffffffffffffdb8);
        Version::GetOverlappingInputs
                  (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
                   (InternalKey *)in_stack_fffffffffffffdd8,
                   (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   in_stack_fffffffffffffdd0);
        sVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_fffffffffffffdb8);
        sVar9 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                          ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)in_stack_fffffffffffffdb8);
        if (sVar8 == sVar9) {
          in_stack_fffffffffffffe18 =
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (*(long *)(in_RDI + 0x28) + 0x18);
          uVar14 = uVar2;
          sVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       in_stack_fffffffffffffdb8);
          sVar9 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                  size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       in_stack_fffffffffffffdb8);
          pCVar13 = pCVar5;
          sVar10 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                   size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )in_stack_fffffffffffffdb8);
          uVar3 = (undefined4)sVar10;
          sVar10 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                   size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )in_stack_fffffffffffffdb8);
          in_stack_fffffffffffffdb8 = pCVar13;
          in_stack_fffffffffffffdc8 = (undefined4)sVar10;
          uVar12 = uVar3;
          in_stack_fffffffffffffe10 = in_stack_fffffffffffffdb8;
          Log((Logger *)in_stack_fffffffffffffe18,
              "Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",(ulong)uVar14,
              sVar8 & 0xffffffff,sVar9 & 0xffffffff,iVar4);
          InternalKey::operator=
                    ((InternalKey *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (InternalKey *)CONCAT44(in_stack_fffffffffffffdc4,uVar3));
          InternalKey::operator=
                    ((InternalKey *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                     (InternalKey *)CONCAT44(in_stack_fffffffffffffdc4,uVar3));
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                    (this_00,pvVar7);
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator=
                    (this_00,pvVar7);
          GetRange2((VersionSet *)CONCAT44(uVar14,in_stack_fffffffffffffe20),
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_fffffffffffffe18,
                    (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                    in_stack_fffffffffffffe10,
                    (InternalKey *)CONCAT44(uVar12,in_stack_fffffffffffffe08),
                    in_stack_fffffffffffffe00);
          in_stack_fffffffffffffdd0 = pIVar6;
          in_stack_fffffffffffffdd8 = pCVar5;
        }
        std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
                  ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                   CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
        InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
      }
    }
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  }
  if ((int)(uVar2 + 2) < 7) {
    Version::GetOverlappingInputs
              (in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec,in_stack_fffffffffffffde0,
               (InternalKey *)in_stack_fffffffffffffdd8,
               (vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_fffffffffffffdd0);
  }
  SVar11 = InternalKey::Encode((InternalKey *)
                               CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  Slice::ToString_abi_cxx11_((Slice *)SVar11.size_);
  level_00 = (int)((ulong)local_f8 >> 0x20);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (in_stack_fffffffffffffe18,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb8);
  VersionEdit::SetCompactPointer
            ((VersionEdit *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),level_00,
             in_stack_fffffffffffffde0);
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  InternalKey::~InternalKey((InternalKey *)in_stack_fffffffffffffdb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VersionSet::SetupOtherInputs(Compaction* c) {
  const int level = c->level();
  InternalKey smallest, largest;

  AddBoundaryInputs(icmp_, current_->files_[level], &c->inputs_[0]);
  GetRange(c->inputs_[0], &smallest, &largest);

  current_->GetOverlappingInputs(level + 1, &smallest, &largest,
                                 &c->inputs_[1]);

  // Get entire range covered by compaction
  InternalKey all_start, all_limit;
  GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);

  // See if we can grow the number of inputs in "level" without
  // changing the number of "level+1" files we pick up.
  if (!c->inputs_[1].empty()) {
    std::vector<FileMetaData*> expanded0;
    current_->GetOverlappingInputs(level, &all_start, &all_limit, &expanded0);
    AddBoundaryInputs(icmp_, current_->files_[level], &expanded0);
    const int64_t inputs0_size = TotalFileSize(c->inputs_[0]);
    const int64_t inputs1_size = TotalFileSize(c->inputs_[1]);
    const int64_t expanded0_size = TotalFileSize(expanded0);
    if (expanded0.size() > c->inputs_[0].size() &&
        inputs1_size + expanded0_size <
            ExpandedCompactionByteSizeLimit(options_)) {
      InternalKey new_start, new_limit;
      GetRange(expanded0, &new_start, &new_limit);
      std::vector<FileMetaData*> expanded1;
      current_->GetOverlappingInputs(level + 1, &new_start, &new_limit,
                                     &expanded1);
      if (expanded1.size() == c->inputs_[1].size()) {
        Log(options_->info_log,
            "Expanding@%d %d+%d (%ld+%ld bytes) to %d+%d (%ld+%ld bytes)\n",
            level, int(c->inputs_[0].size()), int(c->inputs_[1].size()),
            long(inputs0_size), long(inputs1_size), int(expanded0.size()),
            int(expanded1.size()), long(expanded0_size), long(inputs1_size));
        smallest = new_start;
        largest = new_limit;
        c->inputs_[0] = expanded0;
        c->inputs_[1] = expanded1;
        GetRange2(c->inputs_[0], c->inputs_[1], &all_start, &all_limit);
      }
    }
  }

  // Compute the set of grandparent files that overlap this compaction
  // (parent == level+1; grandparent == level+2)
  if (level + 2 < config::kNumLevels) {
    current_->GetOverlappingInputs(level + 2, &all_start, &all_limit,
                                   &c->grandparents_);
  }

  // Update the place where we will do the next compaction for this level.
  // We update this immediately instead of waiting for the VersionEdit
  // to be applied so that if the compaction fails, we will try a different
  // key range next time.
  compact_pointer_[level] = largest.Encode().ToString();
  c->edit_.SetCompactPointer(level, largest);
}